

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

string * __thiscall
CLI::detail::join<std::set<Level,std::less<Level>,std::allocator<Level>>>
          (string *__return_storage_ptr__,detail *this,
          set<Level,_std::less<Level>,_std::allocator<Level>_> *v,string *delim)

{
  bool bVar1;
  reference pLVar2;
  Level *i;
  iterator __end0;
  iterator __begin0;
  set<Level,_std::less<Level>,_std::allocator<Level>_> *__range2;
  size_t start;
  ostringstream s;
  string *delim_local;
  set<Level,_std::less<Level>,_std::allocator<Level>_> *v_local;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&start);
  __range2 = (set<Level,_std::less<Level>,_std::allocator<Level>_> *)0x0;
  __end0 = std::set<Level,_std::less<Level>,_std::allocator<Level>_>::begin
                     ((set<Level,_std::less<Level>,_std::allocator<Level>_> *)this);
  i = (Level *)std::set<Level,_std::less<Level>,_std::allocator<Level>_>::end
                         ((set<Level,_std::less<Level>,_std::allocator<Level>_> *)this);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&i);
    if (!bVar1) break;
    pLVar2 = std::_Rb_tree_const_iterator<Level>::operator*(&__end0);
    if (__range2 != (set<Level,_std::less<Level>,_std::allocator<Level>_> *)0x0) {
      ::std::operator<<((ostream *)&start,(string *)v);
    }
    ::std::ostream::operator<<(&start,*pLVar2);
    std::_Rb_tree_const_iterator<Level>::operator++(&__end0);
    __range2 = (set<Level,_std::less<Level>,_std::allocator<Level>_> *)
               &(__range2->_M_t)._M_impl.field_0x1;
  }
  ::std::__cxx11::ostringstream::str();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&start);
  return __return_storage_ptr__;
}

Assistant:

std::string join(const T &v, std::string delim = ",") {
    std::ostringstream s;
    size_t start = 0;
    for(const auto &i : v) {
        if(start++ > 0)
            s << delim;
        s << i;
    }
    return s.str();
}